

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O1

int Wln_ObjAlloc(Wln_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  uint Entry;
  Hash_IntMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Wln_Vec_t *pWVar4;
  int *piVar5;
  char *pcVar6;
  int *piVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar11;
  int iVar12;
  uint uVar13;
  size_t __size;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  ulong uVar14;
  
  Entry = (p->vTypes).nSize;
  lVar18 = (long)(int)Entry;
  if (Entry == (p->vTypes).nCap) {
    if (p->vFanins == (Wln_Vec_t *)0x0) {
      pWVar4 = (Wln_Vec_t *)malloc(lVar18 << 5);
    }
    else {
      pWVar4 = (Wln_Vec_t *)realloc(p->vFanins,lVar18 << 5);
    }
    p->vFanins = pWVar4;
    memset(pWVar4 + lVar18,0,lVar18 * 0x10);
    if ((p->vTypes).nCap < (int)(Entry * 2)) {
      piVar5 = (p->vTypes).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc(lVar18 << 3);
      }
      else {
        piVar5 = (int *)realloc(piVar5,lVar18 << 3);
      }
      (p->vTypes).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_00361e02;
      (p->vTypes).nCap = Entry * 2;
    }
  }
  if (Entry != (p->vSigns).nSize) {
    __assert_fail("iObj == Vec_StrSize(&p->vSigns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                  ,0x72,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
  }
  if (Entry != (p->vRanges).nSize) {
    __assert_fail("iObj == Vec_IntSize(&p->vRanges)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                  ,0x73,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
  }
  Vec_IntPush(&p->vTypes,Type);
  uVar9 = (p->vSigns).nCap;
  if ((p->vSigns).nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      pcVar6 = (p->vSigns).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,0x10);
      }
      (p->vSigns).pArray = pcVar6;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar9 * 2;
      if ((int)__size <= (int)uVar9) goto LAB_003619cf;
      pcVar6 = (p->vSigns).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(__size);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,__size);
      }
      (p->vSigns).pArray = pcVar6;
    }
    (p->vSigns).nCap = (int)__size;
  }
LAB_003619cf:
  iVar12 = (p->vSigns).nSize;
  (p->vSigns).nSize = iVar12 + 1;
  (p->vSigns).pArray[iVar12] = (char)Signed;
  pHVar1 = p->pRanges;
  iVar12 = pHVar1->vObjs->nSize;
  iVar10 = iVar12 + 3;
  if (-1 < iVar12) {
    iVar10 = iVar12;
  }
  pVVar2 = pHVar1->vTable;
  uVar9 = iVar10 >> 2;
  if (pVVar2->nSize < (int)uVar9) {
    uVar16 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar15 = (uint)uVar16;
        uVar13 = uVar15 + 1;
        uVar14 = (ulong)uVar13;
        uVar17 = uVar16 & 1;
        uVar16 = uVar14;
      } while (uVar17 != 0);
      if (uVar13 < 9) break;
      iVar10 = 5;
      while (uVar13 % (iVar10 - 2U) != 0) {
        uVar3 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar13 < uVar3) goto LAB_00361a5b;
      }
    }
LAB_00361a5b:
    if (pVVar2->nCap < (int)uVar13) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar13 << 2);
      }
      else {
        piVar5 = (int *)realloc(pVVar2->pArray,(long)(int)uVar13 << 2);
      }
      pVVar2->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
LAB_00361e02:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar13;
    }
    if (uVar15 < 0x7fffffff) {
      memset(pVVar2->pArray,0,uVar14 << 2);
    }
    pVVar2->nSize = uVar13;
    if (7 < iVar12) {
      pVVar2 = pHVar1->vObjs;
      uVar16 = 2;
      if (2 < (int)uVar9) {
        uVar16 = (ulong)uVar9;
      }
      uVar17 = 1;
      do {
        uVar15 = pVVar2->nSize;
        if ((long)(int)uVar15 <= (long)(uVar17 * 4)) goto LAB_00361d48;
        piVar5 = pVVar2->pArray;
        piVar5[uVar17 * 4 + 3] = 0;
        uVar13 = pHVar1->vTable->nSize;
        uVar14 = (ulong)(uint)(piVar5[uVar17 * 4 + 1] * 0x1ec1 + piVar5[uVar17 * 4] * 0x1051) %
                 (ulong)uVar13;
        iVar12 = (int)uVar14;
        if ((iVar12 < 0) || ((int)uVar13 <= iVar12)) goto LAB_00361d48;
        piVar7 = pHVar1->vTable->pArray + uVar14;
        while( true ) {
          iVar12 = *piVar7;
          if (iVar12 == 0) {
            piVar19 = (int *)0x0;
          }
          else {
            if ((iVar12 < 0) ||
               (uVar13 = iVar12 * 4,
               uVar15 == uVar13 || SBORROW4(uVar15,uVar13) != (int)(uVar15 + iVar12 * -4) < 0))
            goto LAB_00361d48;
            piVar19 = piVar5 + uVar13;
          }
          if (piVar19 == (int *)0x0) {
            if (iVar12 != 0) goto LAB_00361d67;
            goto LAB_00361b8e;
          }
          if ((*piVar19 == piVar5[uVar17 * 4]) && (piVar19[1] == piVar5[uVar17 * 4 + 1])) break;
          piVar7 = piVar19 + 3;
        }
        if (iVar12 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                        ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
        }
LAB_00361b8e:
        *piVar7 = (int)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar16);
    }
  }
  uVar15 = pHVar1->vTable->nSize;
  uVar16 = (ulong)(uint)(Beg * 0x1ec1 + End * 0x1051) % (ulong)uVar15;
  iVar12 = (int)uVar16;
  if ((iVar12 < 0) || ((int)uVar15 <= iVar12)) {
LAB_00361d48:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar8 = (uint *)(pHVar1->vTable->pArray + uVar16);
  while( true ) {
    uVar15 = *puVar8;
    if (uVar15 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      if ((int)uVar15 < 0) goto LAB_00361d48;
      uVar13 = uVar15 * 4;
      uVar3 = pHVar1->vObjs->nSize;
      if (uVar3 == uVar13 || SBORROW4(uVar3,uVar13) != (int)(uVar3 + uVar15 * -4) < 0)
      goto LAB_00361d48;
      piVar5 = pHVar1->vObjs->pArray + uVar13;
    }
    if (piVar5 == (int *)0x0) break;
    if ((*piVar5 == End) && (piVar5[1] == Beg)) {
      if (uVar15 == 0) {
LAB_00361c2d:
        *puVar8 = uVar9;
        Vec_IntPush(pHVar1->vObjs,End);
        Vec_IntPush(pHVar1->vObjs,Beg);
        Vec_IntPush(pHVar1->vObjs,0);
        Vec_IntPush(pHVar1->vObjs,0);
        uVar15 = uVar9;
      }
      Vec_IntPush(&p->vRanges,uVar15);
      if ((-1 < (int)Entry) && ((int)Entry < (p->vTypes).nSize)) {
        if ((p->vTypes).pArray[Entry] == 3) {
          paVar11 = &p->vFanins[lVar18].field_2;
          if (2 < p->vFanins[lVar18].nSize) {
            paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar11->pArray[0];
          }
          paVar11->Array[1] = (p->vCis).nSize;
          Vec_IntPush(&p->vCis,Entry);
        }
        if ((int)Entry < (p->vTypes).nSize) {
          if ((p->vTypes).pArray[Entry] == 4) {
            paVar11 = &p->vFanins[lVar18].field_2;
            if (2 < p->vFanins[lVar18].nSize) {
              paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar11->pArray[0];
            }
            paVar11->Array[1] = (p->vCos).nSize;
            Vec_IntPush(&p->vCos,Entry);
          }
          if ((int)Entry < (p->vTypes).nSize) {
            if ((p->vTypes).pArray[Entry] == 0x59) {
              Vec_IntPush(&p->vFfs,Entry);
            }
            p->nObjs[Type] = p->nObjs[Type] + 1;
            return Entry;
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    puVar8 = (uint *)(piVar5 + 3);
  }
  if (uVar15 != 0) {
LAB_00361d67:
    __assert_fail("*pPlace == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                  ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
  }
  goto LAB_00361c2d;
}

Assistant:

int Wln_ObjAlloc( Wln_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    int iObj = Vec_IntSize(&p->vTypes);
    if ( iObj == Vec_IntCap(&p->vTypes) )
    {
        p->vFanins = ABC_REALLOC( Wln_Vec_t, p->vFanins, 2 * iObj );
        memset( p->vFanins + iObj, 0, sizeof(Wln_Vec_t) * iObj );
        Vec_IntGrow( &p->vTypes, 2 * iObj );
    }
    assert( iObj == Vec_StrSize(&p->vSigns) );
    assert( iObj == Vec_IntSize(&p->vRanges) );
    Vec_IntPush( &p->vTypes, Type );
    Vec_StrPush( &p->vSigns, (char)Signed );
    Vec_IntPush( &p->vRanges, Hash_Int2ManInsert(p->pRanges, End, Beg, 0) );
    if ( Wln_ObjIsCi(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCis) ), Vec_IntPush( &p->vCis, iObj );
    if ( Wln_ObjIsCo(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCos) ), Vec_IntPush( &p->vCos, iObj );
    if ( Wln_ObjIsFf(p, iObj) ) Vec_IntPush( &p->vFfs, iObj );
    p->nObjs[Type]++;
    return iObj;
}